

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLstack.c
# Opt level: O3

void RDL_stack_delete(RDL_stack *stack)

{
  free(stack->elements);
  free(stack);
  return;
}

Assistant:

void RDL_stack_delete(RDL_stack* stack)
{
  free(stack->elements);
  stack->elements = NULL;
  stack->top = NULL;
  stack->reserved = 0;
  stack->size = 0;
  free(stack);
}